

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.hpp
# Opt level: O0

void __thiscall Pcode::~Pcode(Pcode *this)

{
  Pcode *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_comment);
  std::__cxx11::string::~string((string *)&this->m_num3);
  std::__cxx11::string::~string((string *)&this->m_num2);
  std::__cxx11::string::~string((string *)&this->m_num1);
  return;
}

Assistant:

Pcode(PcodeType op, string num1, string num2, string num3) : m_op(op), m_num1(num1), m_num2(num2), m_num3(num3) {
        m_comment = string("");
    }